

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::FixupOutPolygon(Clipper *this,OutRec *outRec)

{
  OutPt *pOVar1;
  OutPt *pOVar2;
  bool bVar3;
  OutPt *pOVar4;
  OutPt *local_38;
  
  outRec->pts = outRec->bottomPt;
  pOVar4 = (OutPt *)0x0;
  local_38 = outRec->bottomPt;
  while ((pOVar1 = local_38->prev, pOVar1 != local_38 && (pOVar2 = local_38->next, pOVar1 != pOVar2)
         )) {
    if (((local_38->pt).Y == (pOVar2->pt).Y && (local_38->pt).X == (pOVar2->pt).X) ||
       (bVar3 = SlopesEqual(pOVar1->pt,local_38->pt,pOVar2->pt,
                            (bool)(this->_vptr_Clipper[-3] + 0x10)
                                  [(long)&(this->m_PolyOuts).
                                          super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                  ]), bVar3)) {
      if (local_38 == outRec->bottomPt) {
        outRec->bottomPt = (OutPt *)0x0;
      }
      pOVar4 = local_38->next;
      local_38->prev->next = pOVar4;
      pOVar1 = local_38->prev;
      pOVar4->prev = pOVar1;
      operator_delete(local_38,0x28);
      pOVar4 = (OutPt *)0x0;
      local_38 = pOVar1;
    }
    else {
      if (local_38 == pOVar4) {
        if (outRec->bottomPt != (OutPt *)0x0) {
          return;
        }
        pOVar4 = GetBottomPt(local_38);
        outRec->bottomPt = pOVar4;
        pOVar4->idx = outRec->idx;
        outRec->pts = outRec->bottomPt;
        return;
      }
      if (pOVar4 == (OutPt *)0x0) {
        pOVar4 = local_38;
      }
      local_38 = local_38->next;
    }
  }
  DisposeOutPts(&local_38);
  outRec->pts = (OutPt *)0x0;
  outRec->bottomPt = (OutPt *)0x0;
  return;
}

Assistant:

void Clipper::FixupOutPolygon(OutRec &outRec)
{
  //FixupOutPolygon() - removes duplicate points and simplifies consecutive
  //parallel edges by removing the middle vertex.
  OutPt *lastOK = 0;
  outRec.pts = outRec.bottomPt;
  OutPt *pp = outRec.bottomPt;

  for (;;)
  {
    if (pp->prev == pp || pp->prev == pp->next )
    {
      DisposeOutPts(pp);
      outRec.pts = 0;
      outRec.bottomPt = 0;
      return;
    }
    //test for duplicate points and for same slope (cross-product) ...
    if ( PointsEqual(pp->pt, pp->next->pt) ||
      SlopesEqual(pp->prev->pt, pp->pt, pp->next->pt, m_UseFullRange) )
    {
      lastOK = 0;
      OutPt *tmp = pp;
      if (pp == outRec.bottomPt)
        outRec.bottomPt = 0; //flags need for updating
      pp->prev->next = pp->next;
      pp->next->prev = pp->prev;
      pp = pp->prev;
      delete tmp;
    }
    else if (pp == lastOK) break;
    else
    {
      if (!lastOK) lastOK = pp;
      pp = pp->next;
    }
  }
  if (!outRec.bottomPt) {
    outRec.bottomPt = GetBottomPt(pp);
    outRec.bottomPt->idx = outRec.idx;
    outRec.pts = outRec.bottomPt;
  }
}